

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspatch.c
# Opt level: O3

int bspatch(uint8_t *source,int64_t sourcesize,uint8_t *target,int64_t targetsize,
           bspatch_stream *stream)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  uint8_t buf [8];
  int64_t ctrl [3];
  byte local_78;
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  long local_70;
  int64_t local_68;
  uint8_t *local_60;
  long local_58;
  uint8_t *local_50;
  ulong local_48 [3];
  
  if (0 < targetsize) {
    lVar2 = 0;
    local_70 = 0;
    local_68 = targetsize;
    local_60 = target;
    local_50 = source;
    do {
      lVar5 = 0;
      do {
        iVar1 = (*stream->read)(stream,&local_78,8);
        if (iVar1 != 0) {
          return -1;
        }
        uVar4 = (ulong)local_78 |
                (ulong)local_77 << 8 |
                ((ulong)local_76 |
                (ulong)local_75 << 8 |
                (ulong)((uint)local_74 |
                       (uint)local_73 << 8 | ((uint)local_72 | (local_71 & 0x7f) << 8) << 0x10) <<
                0x10) << 0x10;
        uVar3 = -uVar4;
        if (-1 < (char)local_71) {
          uVar3 = uVar4;
        }
        local_48[lVar5] = uVar3;
        uVar3 = local_48[0];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      local_58 = lVar2 + local_48[0];
      if (local_68 < local_58) {
        return -1;
      }
      puVar6 = local_60 + lVar2;
      iVar1 = (*stream->read)(stream,puVar6,(int)local_48[0]);
      if (iVar1 != 0) {
        return -1;
      }
      lVar2 = local_70;
      uVar4 = uVar3;
      if (0 < (long)uVar3) {
        do {
          if (lVar2 < sourcesize && -1 < lVar2) {
            *puVar6 = *puVar6 + local_50[lVar2];
          }
          puVar6 = puVar6 + 1;
          uVar4 = uVar4 - 1;
          lVar2 = lVar2 + 1;
        } while (uVar4 != 0);
      }
      lVar2 = local_48[1] + local_58;
      if (local_68 < lVar2) {
        return -1;
      }
      iVar1 = (*stream->read)(stream,local_60 + local_58,(int)local_48[1]);
      if (iVar1 != 0) {
        return -1;
      }
      local_70 = uVar3 + local_70 + local_48[2];
    } while (lVar2 < local_68);
  }
  return 0;
}

Assistant:

int bspatch(const uint8_t* source, int64_t sourcesize, uint8_t* target, int64_t targetsize, struct bspatch_stream* stream)
{
	uint8_t buf[8];
	int64_t oldpos,newpos;
	int64_t ctrl[3];
	int64_t i;

	oldpos=0;newpos=0;
	while(newpos<targetsize) {
		/* Read control data */
		for(i=0;i<=2;i++) {
			if (stream->read(stream, buf, 8))
				return -1;
			ctrl[i]=offtin(buf);
		};

		/* Sanity-check */
		if(newpos+ctrl[0]>targetsize)
			return -1;

		/* Read diff string */
		if (stream->read(stream, target + newpos, ctrl[0]))
			return -1;

		/* Add old data to diff string */
		for(i=0;i<ctrl[0];i++)
			if((oldpos+i>=0) && (oldpos+i<sourcesize))
				target[newpos+i]+=source[oldpos+i];

		/* Adjust pointers */
		newpos+=ctrl[0];
		oldpos+=ctrl[0];

		/* Sanity-check */
		if(newpos+ctrl[1]>targetsize)
			return -1;

		/* Read extra string */
		if (stream->read(stream, target + newpos, ctrl[1]))
			return -1;

		/* Adjust pointers */
		newpos+=ctrl[1];
		oldpos+=ctrl[2];
	};

	return 0;
}